

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_4f39de::Db::parseBaseUnresolvedName(Db *this)

{
  bool bVar1;
  Node *pNVar2;
  NameWithTemplateArgs *pNVar3;
  StringView S;
  StringView S_00;
  Node *TA;
  Node *Oper;
  
  if ((this->Last != this->First) && ((int)*this->First - 0x30U < 10)) {
    pNVar2 = parseSimpleId(this);
    return pNVar2;
  }
  S.Last = "";
  S.First = "dn";
  bVar1 = consumeIf(this,S);
  if (bVar1) {
    if ((this->Last == this->First) || (9 < (int)*this->First - 0x30U)) {
      pNVar2 = parseUnresolvedType(this);
    }
    else {
      pNVar2 = parseSimpleId(this);
    }
    if (pNVar2 == (Node *)0x0) {
      pNVar3 = (NameWithTemplateArgs *)0x0;
    }
    else {
      pNVar3 = (NameWithTemplateArgs *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
      (pNVar3->super_Node).K = KDtorName;
      (pNVar3->super_Node).RHSComponentCache = No;
      (pNVar3->super_Node).ArrayCache = No;
      (pNVar3->super_Node).FunctionCache = No;
      (pNVar3->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00241d58;
      pNVar3->Name = pNVar2;
    }
  }
  else {
    S_00.Last = "";
    S_00.First = "on";
    consumeIf(this,S_00);
    Oper = parseOperatorName(this,(NameState *)0x0);
    pNVar3 = (NameWithTemplateArgs *)0x0;
    if ((((NameWithTemplateArgs *)Oper != (NameWithTemplateArgs *)0x0) &&
        (pNVar3 = (NameWithTemplateArgs *)Oper, this->Last != this->First)) && (*this->First == 'I')
       ) {
      TA = parseTemplateArgs(this,false);
      pNVar3 = (NameWithTemplateArgs *)0x0;
      if (TA != (Node *)0x0) {
        pNVar3 = (anonymous_namespace)::Db::
                 make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                           ((Db *)this,&Oper,&TA);
      }
    }
  }
  return &pNVar3->super_Node;
}

Assistant:

Node *Db::parseBaseUnresolvedName() {
  if (std::isdigit(look()))
    return parseSimpleId();

  if (consumeIf("dn"))
    return parseDestructorName();

  consumeIf("on");

  Node *Oper = parseOperatorName(/*NameState=*/nullptr);
  if (Oper == nullptr)
    return nullptr;
  if (look() == 'I') {
    Node *TA = parseTemplateArgs();
    if (TA == nullptr)
      return nullptr;
    return make<NameWithTemplateArgs>(Oper, TA);
  }
  return Oper;
}